

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportFileGenerator::PopulateCompatibleInterfaceProperties
          (cmExportFileGenerator *this,cmGeneratorTarget *gtarget,ImportPropertyMap *properties)

{
  _Rb_tree_header *p_Var1;
  pointer pbVar2;
  TargetType TVar3;
  _Base_ptr p_Var4;
  cmExportFileGenerator *pcVar5;
  string *cn;
  pointer config;
  allocator<char> local_a9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configNames;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ifaceProperties;
  string local_50;
  
  pcVar5 = (cmExportFileGenerator *)&ifaceProperties;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)pcVar5,"COMPATIBLE_INTERFACE_BOOL",(allocator<char> *)&configNames);
  PopulateInterfaceProperty(pcVar5,(string *)&ifaceProperties,gtarget,properties);
  std::__cxx11::string::~string((string *)&ifaceProperties);
  pcVar5 = (cmExportFileGenerator *)&ifaceProperties;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)pcVar5,"COMPATIBLE_INTERFACE_STRING",(allocator<char> *)&configNames);
  PopulateInterfaceProperty(pcVar5,(string *)&ifaceProperties,gtarget,properties);
  std::__cxx11::string::~string((string *)&ifaceProperties);
  pcVar5 = (cmExportFileGenerator *)&ifaceProperties;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)pcVar5,"COMPATIBLE_INTERFACE_NUMBER_MIN",(allocator<char> *)&configNames);
  PopulateInterfaceProperty(pcVar5,(string *)&ifaceProperties,gtarget,properties);
  std::__cxx11::string::~string((string *)&ifaceProperties);
  pcVar5 = (cmExportFileGenerator *)&ifaceProperties;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)pcVar5,"COMPATIBLE_INTERFACE_NUMBER_MAX",(allocator<char> *)&configNames);
  PopulateInterfaceProperty(pcVar5,(string *)&ifaceProperties,gtarget,properties);
  std::__cxx11::string::~string((string *)&ifaceProperties);
  p_Var1 = &ifaceProperties._M_t._M_impl.super__Rb_tree_header;
  ifaceProperties._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  ifaceProperties._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  ifaceProperties._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ifaceProperties._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  ifaceProperties._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&configNames,"COMPATIBLE_INTERFACE_BOOL",&local_a9);
  getPropertyContents(gtarget,(string *)&configNames,&ifaceProperties);
  std::__cxx11::string::~string((string *)&configNames);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&configNames,"COMPATIBLE_INTERFACE_STRING",&local_a9);
  getPropertyContents(gtarget,(string *)&configNames,&ifaceProperties);
  std::__cxx11::string::~string((string *)&configNames);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&configNames,"COMPATIBLE_INTERFACE_NUMBER_MIN",&local_a9);
  getPropertyContents(gtarget,(string *)&configNames,&ifaceProperties);
  std::__cxx11::string::~string((string *)&configNames);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&configNames,"COMPATIBLE_INTERFACE_NUMBER_MAX",&local_a9);
  getPropertyContents(gtarget,(string *)&configNames,&ifaceProperties);
  std::__cxx11::string::~string((string *)&configNames);
  TVar3 = cmGeneratorTarget::GetType(gtarget);
  if (TVar3 != INTERFACE_LIBRARY) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&configNames,"",&local_a9);
    getCompatibleInterfaceProperties(gtarget,&ifaceProperties,(string *)&configNames);
    std::__cxx11::string::~string((string *)&configNames);
    configNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    configNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    configNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    cmMakefile::GetConfigurations(&local_50,gtarget->Target->Makefile,&configNames,true);
    std::__cxx11::string::~string((string *)&local_50);
    pbVar2 = configNames.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (config = configNames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; config != pbVar2; config = config + 1)
    {
      getCompatibleInterfaceProperties(gtarget,&ifaceProperties,config);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&configNames);
  }
  for (p_Var4 = ifaceProperties._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != p_Var1; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    pcVar5 = (cmExportFileGenerator *)&configNames;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&configNames
                   ,"INTERFACE_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var4 + 1)
                  );
    PopulateInterfaceProperty(pcVar5,(string *)&configNames,gtarget,properties);
    std::__cxx11::string::~string((string *)&configNames);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&ifaceProperties._M_t);
  return;
}

Assistant:

void cmExportFileGenerator::PopulateCompatibleInterfaceProperties(
  cmGeneratorTarget* gtarget, ImportPropertyMap& properties)
{
  this->PopulateInterfaceProperty("COMPATIBLE_INTERFACE_BOOL", gtarget,
                                  properties);
  this->PopulateInterfaceProperty("COMPATIBLE_INTERFACE_STRING", gtarget,
                                  properties);
  this->PopulateInterfaceProperty("COMPATIBLE_INTERFACE_NUMBER_MIN", gtarget,
                                  properties);
  this->PopulateInterfaceProperty("COMPATIBLE_INTERFACE_NUMBER_MAX", gtarget,
                                  properties);

  std::set<std::string> ifaceProperties;

  getPropertyContents(gtarget, "COMPATIBLE_INTERFACE_BOOL", ifaceProperties);
  getPropertyContents(gtarget, "COMPATIBLE_INTERFACE_STRING", ifaceProperties);
  getPropertyContents(gtarget, "COMPATIBLE_INTERFACE_NUMBER_MIN",
                      ifaceProperties);
  getPropertyContents(gtarget, "COMPATIBLE_INTERFACE_NUMBER_MAX",
                      ifaceProperties);

  if (gtarget->GetType() != cmStateEnums::INTERFACE_LIBRARY) {
    getCompatibleInterfaceProperties(gtarget, ifaceProperties, "");

    std::vector<std::string> configNames;
    gtarget->Target->GetMakefile()->GetConfigurations(configNames);

    for (std::string const& cn : configNames) {
      getCompatibleInterfaceProperties(gtarget, ifaceProperties, cn);
    }
  }

  for (std::string const& ip : ifaceProperties) {
    this->PopulateInterfaceProperty("INTERFACE_" + ip, gtarget, properties);
  }
}